

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
* slang::ast::anon_unknown_0::getInterfacePortInfo
            (tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
             *__return_storage_ptr__,Scope *scope,InterfacePortHeaderSyntax *header)

{
  group_type_pointer pgVar1;
  Compilation *this;
  DotMemberClauseSyntax *pDVar2;
  value_type_pointer pbVar3;
  ulong uVar4;
  Symbol *__n;
  int iVar5;
  uint64_t uVar6;
  ulong uVar7;
  Diagnostic *pDVar8;
  uint uVar9;
  DefinitionSymbol *pDVar10;
  ulong uVar11;
  ulong uVar12;
  group_type_pointer pgVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  string_view sVar35;
  SourceRange SVar36;
  Token member;
  Token token;
  DefinitionLookupResult local_c8;
  long local_b0;
  ulong local_a8;
  group_type_pointer local_a0;
  ulong local_98;
  ulong local_90;
  ConfigBlockSymbol *local_88;
  ulong local_80;
  SourceRange local_78;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  uchar uStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  uchar uStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  uchar uStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  uchar uStack_59;
  Token local_58;
  Token local_48;
  
  this = scope->compilation;
  local_48.kind = (header->nameOrKeyword).kind;
  local_48._2_1_ = (header->nameOrKeyword).field_0x2;
  local_48.numFlags.raw = (header->nameOrKeyword).numFlags.raw;
  local_48.rawLen = (header->nameOrKeyword).rawLen;
  local_48.info = (header->nameOrKeyword).info;
  sVar35 = parsing::Token::valueText(&local_48);
  local_78 = parsing::Token::range(&local_48);
  Compilation::getDefinition(&local_c8,this,sVar35,scope,local_78,(DiagCode)0xce0006);
  pDVar10 = (DefinitionSymbol *)local_c8.definition;
  if ((DefinitionSymbol *)local_c8.definition != (DefinitionSymbol *)0x0) {
    if (((Symbol *)&(local_c8.definition)->kind)->kind == Definition) {
      local_c8.definition = (Symbol *)0x0;
      local_c8.configRoot = (ConfigBlockSymbol *)0x0;
      if (*(DefinitionKind *)((long)pDVar10 + 0x48) == Interface) {
        pDVar2 = header->modport;
        if (pDVar2 != (DotMemberClauseSyntax *)0x0) {
          local_58.kind = (pDVar2->member).kind;
          local_58._2_1_ = (pDVar2->member).field_0x2;
          local_58.numFlags.raw = (pDVar2->member).numFlags.raw;
          local_58.rawLen = (pDVar2->member).rawLen;
          local_58.info = (pDVar2->member).info;
          local_c8._0_16_ = parsing::Token::valueText(&local_58);
          uVar6 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                            ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                             ((long)pDVar10 + 0x280),
                             (basic_string_view<char,_std::char_traits<char>_> *)&local_c8);
          uVar11 = uVar6 >> ((byte)(((flat_hash_set<std::string_view> *)((long)pDVar10 + 0x280))->
                                   table_).
                                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                                   .arrays.groups_size_index & 0x3f);
          pgVar13 = (((flat_hash_set<std::string_view> *)((long)pDVar10 + 0x280))->table_).
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                    .arrays.groups_;
          lVar16 = (uVar6 & 0xff) * 4;
          uVar19 = (&UNK_0046cabc)[lVar16];
          uVar20 = (&UNK_0046cabd)[lVar16];
          uVar21 = (&UNK_0046cabe)[lVar16];
          uVar22 = (&UNK_0046cabf)[lVar16];
          __n = local_c8.definition;
          local_88 = local_c8.configRoot;
          uVar7 = (ulong)((uint)uVar6 & 7);
          uVar15 = 0;
          uVar23 = uVar19;
          uVar24 = uVar20;
          uVar25 = uVar21;
          uVar26 = uVar22;
          uVar27 = uVar19;
          uVar28 = uVar20;
          uVar29 = uVar21;
          uVar30 = uVar22;
          uVar31 = uVar19;
          uVar32 = uVar20;
          uVar33 = uVar21;
          uVar34 = uVar22;
          do {
            pgVar1 = pgVar13 + uVar11;
            auVar18[0] = -(pgVar1->m[0].n == uVar19);
            auVar18[1] = -(pgVar1->m[1].n == uVar20);
            auVar18[2] = -(pgVar1->m[2].n == uVar21);
            auVar18[3] = -(pgVar1->m[3].n == uVar22);
            auVar18[4] = -(pgVar1->m[4].n == uVar23);
            auVar18[5] = -(pgVar1->m[5].n == uVar24);
            auVar18[6] = -(pgVar1->m[6].n == uVar25);
            auVar18[7] = -(pgVar1->m[7].n == uVar26);
            auVar18[8] = -(pgVar1->m[8].n == uVar27);
            auVar18[9] = -(pgVar1->m[9].n == uVar28);
            auVar18[10] = -(pgVar1->m[10].n == uVar29);
            auVar18[0xb] = -(pgVar1->m[0xb].n == uVar30);
            auVar18[0xc] = -(pgVar1->m[0xc].n == uVar31);
            auVar18[0xd] = -(pgVar1->m[0xd].n == uVar32);
            auVar18[0xe] = -(pgVar1->m[0xe].n == uVar33);
            auVar18[0xf] = -(pgVar1->m[0xf].n == uVar34);
            uVar9 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
            uVar12 = uVar11;
            uVar14 = uVar15;
            lVar16 = uVar11 * 0x10;
            if (uVar9 != 0) {
              pbVar3 = (((flat_hash_set<std::string_view> *)((long)pDVar10 + 0x280))->table_).
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .arrays.elements_;
              local_b0 = uVar11 * 0x10;
              local_a8 = uVar15;
              local_a0 = pgVar13;
              local_98 = uVar11;
              local_90 = uVar7;
              local_68 = uVar19;
              uStack_67 = uVar20;
              uStack_66 = uVar21;
              uStack_65 = uVar22;
              uStack_64 = uVar23;
              uStack_63 = uVar24;
              uStack_62 = uVar25;
              uStack_61 = uVar26;
              uStack_60 = uVar27;
              uStack_5f = uVar28;
              uStack_5e = uVar29;
              uStack_5d = uVar30;
              uStack_5c = uVar31;
              uStack_5b = uVar32;
              uStack_5a = uVar33;
              uStack_59 = uVar34;
              do {
                iVar5 = 0;
                if (uVar9 != 0) {
                  for (; (uVar9 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
                  }
                }
                bVar17 = __n == *(Symbol **)
                                 ((long)&pbVar3[uVar11 * 0xf]._M_len + (ulong)(uint)(iVar5 << 4));
                lVar16 = (long)&pbVar3[uVar11 * 0xf]._M_len + (ulong)(uint)(iVar5 << 4);
                uVar7 = (ulong)uVar9;
                if (bVar17 && __n != (Symbol *)0x0) {
                  local_80 = (ulong)uVar9;
                  iVar5 = bcmp(local_88,*(void **)(lVar16 + 8),(size_t)__n);
                  bVar17 = iVar5 == 0;
                  uVar7 = local_80;
                  uVar19 = local_68;
                  uVar20 = uStack_67;
                  uVar21 = uStack_66;
                  uVar22 = uStack_65;
                  uVar23 = uStack_64;
                  uVar24 = uStack_63;
                  uVar25 = uStack_62;
                  uVar26 = uStack_61;
                  uVar27 = uStack_60;
                  uVar28 = uStack_5f;
                  uVar29 = uStack_5e;
                  uVar30 = uStack_5d;
                  uVar31 = uStack_5c;
                  uVar32 = uStack_5b;
                  uVar33 = uStack_5a;
                  uVar34 = uStack_59;
                }
                if (bVar17) goto LAB_004071c6;
                uVar9 = (uint)uVar7 - 1 & (uint)uVar7;
                uVar7 = local_90;
                uVar12 = local_98;
                pgVar13 = local_a0;
                uVar14 = local_a8;
                lVar16 = local_b0;
              } while (uVar9 != 0);
            }
            if ((pgVar13->m[lVar16 + 0xf].n &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[uVar7]) == 0) break;
            uVar4 = (((flat_hash_set<std::string_view> *)((long)pDVar10 + 0x280))->table_).
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                    .arrays.groups_size_mask;
            uVar15 = uVar14 + 1;
            uVar11 = uVar12 + uVar14 + 1 & uVar4;
          } while (uVar15 <= uVar4);
          lVar16 = 0;
LAB_004071c6:
          if ((lVar16 == 0) && (local_c8.definition != (Symbol *)0x0)) {
            SVar36 = parsing::Token::range(&local_58);
            pDVar8 = Scope::addDiag(scope,(DiagCode)0x22000a,SVar36);
            Diagnostic::operator<<(pDVar8,(string_view)local_c8._0_16_);
            Diagnostic::operator<<(pDVar8,((Symbol *)&(pDVar10->super_Symbol).kind)->name);
            local_c8.definition = (Symbol *)0x0;
            local_c8.configRoot = (ConfigBlockSymbol *)0x0;
          }
        }
      }
      else {
        SVar36 = parsing::Token::range(&header->nameOrKeyword);
        pDVar8 = Scope::addDiag(scope,(DiagCode)0xa10006,SVar36);
        Diagnostic::operator<<(pDVar8,((Symbol *)&(pDVar10->super_Symbol).kind)->name);
        Diagnostic::addNote(pDVar8,(DiagCode)0x50001,
                            ((Symbol *)&(pDVar10->super_Symbol).kind)->location);
        pDVar10 = (DefinitionSymbol *)0x0;
      }
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ).super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
      super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_len = (size_t)local_c8.definition;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ).super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
      super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_str = (char *)local_c8.configRoot;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ).super__Head_base<0UL,_const_slang::ast::DefinitionSymbol_*,_false>._M_head_impl = pDVar10;
      return __return_storage_ptr__;
    }
    SVar36 = parsing::Token::range(&local_48);
    pDVar8 = Scope::addDiag(scope,(DiagCode)0xce0006,SVar36);
    sVar35 = parsing::Token::valueText(&local_48);
    Diagnostic::operator<<(pDVar8,sVar35);
  }
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ).super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
  super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl =
       (basic_string_view<char,_std::char_traits<char>_>)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ).super__Head_base<0UL,_const_slang::ast::DefinitionSymbol_*,_false>._M_head_impl =
       (DefinitionSymbol *)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<const DefinitionSymbol*, std::string_view> getInterfacePortInfo(
    const Scope& scope, const InterfacePortHeaderSyntax& header) {

    auto& comp = scope.getCompilation();
    auto token = header.nameOrKeyword;
    auto def = comp.getDefinition(token.valueText(), scope, token.range(), diag::UnknownInterface)
                   .definition;
    if (!def || def->kind != SymbolKind::Definition) {
        // If we got a result then getDefinition didn't error, so do it ourselves.
        if (def)
            scope.addDiag(diag::UnknownInterface, token.range()) << token.valueText();
        return {nullptr, {}};
    }

    std::string_view modport;
    auto defSym = &def->as<DefinitionSymbol>();

    if (defSym->definitionKind != DefinitionKind::Interface) {
        auto& diag = scope.addDiag(diag::PortTypeNotInterfaceOrData, header.nameOrKeyword.range());
        diag << defSym->name;
        diag.addNote(diag::NoteDeclarationHere, defSym->location);
        defSym = nullptr;
    }
    else if (header.modport) {
        auto member = header.modport->member;
        modport = member.valueText();
        if (auto it = defSym->modports.find(modport);
            it == defSym->modports.end() && !modport.empty()) {
            auto& diag = scope.addDiag(diag::NotAModport, member.range());
            diag << modport;
            diag << defSym->name;
            modport = {};
        }
    }

    return {defSym, modport};
}